

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPool.cpp
# Opt level: O0

bool __thiscall memt::BufferPool::fromPool(BufferPool *this,void *ptr)

{
  Block *pBVar1;
  Block *block;
  void *ptr_local;
  BufferPool *this_local;
  
  pBVar1 = MemoryBlocks::blockOf(&this->_blocks,ptr);
  return pBVar1 != (Block *)0x0;
}

Assistant:

bool BufferPool::fromPool(const void* ptr) const {
	MemoryBlocks::Block const* block = _blocks.blockOf(ptr);
	if (block == 0)
	  return false;
#ifdef MEMT_DEBUG
	const size_t offset =
	  static_cast<size_t>(static_cast<const char*>(ptr) - block->begin());
	MEMT_ASSERT(offset % _bufferSize == 0); // otherwise not a valid pointer
#endif
	return true;
  }